

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::localReturnValue(StackInterpreter *this,Oop value)

{
  long *plVar1;
  long lVar2;
  StackMemory *pSVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  size_t sVar6;
  
  plVar1 = (long *)(this->stack->stackFrame).framePointer;
  if (*plVar1 != 0) {
    if (*(char *)((long)plVar1 + -0xe) != '\0') {
      lVar2 = plVar1[-3];
      *(undefined8 **)(lVar2 + 8) = &NilObject;
      *(undefined8 **)(lVar2 + 0x10) = &NilObject;
      *(undefined8 *)(lVar2 + 0x18) = 1;
    }
    pSVar3 = this->stack;
    puVar4 = (pSVar3->stackFrame).framePointer;
    (pSVar3->stackFrame).stackPointer = puVar4;
    puVar5 = *(uint8_t **)puVar4;
    (pSVar3->stackFrame).stackPointer = puVar4 + 8;
    (pSVar3->stackFrame).framePointer = puVar5;
    sVar6 = *(size_t *)(puVar4 + 8);
    (pSVar3->stackFrame).stackPointer = puVar4 + 0x10;
    this->pc = sVar6;
    sVar6 = this->argumentCount;
    (pSVar3->stackFrame).stackPointer = puVar4 + sVar6 * 8 + 0x10;
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar4 + sVar6 * 8 + 0x10) = value.field_0;
    fetchFrameData(this);
    sVar6 = this->pc;
    if (sVar6 != 0) {
      this->pc = sVar6 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar6);
    }
    return;
  }
  baseReturnValue(this,value);
  return;
}

Assistant:

void localReturnValue(Oop value)
    {
        auto prevFramePointer = stack->getPrevFramePointer();
        if (prevFramePointer == nullptr)
        {
            return baseReturnValue(value);
        }

        // Widow the current context.
        if (stack->getCurrentFrame().hasContext())
            widowContext(reinterpret_cast<Context*> (stack->getThisContext().pointer));

        // Restore the stack into beginning of the frame pointer.
		stack->setStackPointer(stack->getFramePointer());
		stack->setFramePointer(stack->popPointer());

		// Pop the return pc
		popPC();

		// Pop the arguments and the receiver.
		popMultiplesOops(argumentCount + 1);

		// Push the return value.
		pushOop(value);

        // Re fetch the frame data to continue.
        fetchFrameData();

		// If there is no pc, then it means that we are returning.
		if(pc)
		{
			// Fetch the next instruction
			fetchNextInstructionOpcode();
		}
    }